

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::EscapeOperator>>
               (string_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar3;
  undefined8 uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Vector *vector;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  string_t sVar14;
  Vector *vector_1;
  anon_union_16_2_67f50693_for_value local_68;
  ValidityMask *local_58;
  idx_t local_50;
  Vector *local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_58 = mask;
  local_50 = count;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 8;
      do {
        puVar1 = (undefined8 *)((long)ldata + lVar7 + -8);
        local_68._0_8_ = *puVar1;
        local_68.pointer.ptr = (char *)puVar1[1];
        sVar14 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                           ((string_t *)&local_68.pointer,(Vector *)dataptr);
        *(long *)((long)result_data + lVar7 + -8) = sVar14.value._0_8_;
        *(long *)((long)&result_data->value + lVar7) = sVar14.value._8_8_;
        lVar7 = lVar7 + 0x10;
        local_50 = local_50 - 1;
      } while (local_50 != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68.pointer,(unsigned_long **)mask,&local_38);
      uVar4 = local_68.pointer.ptr;
      uVar3 = local_68._0_8_;
      local_68._0_8_ = 0;
      local_68.pointer.ptr = (char *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.pointer.ptr !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.pointer.ptr);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_40 = count + 0x3f >> 6;
      uVar6 = 0;
      uVar12 = 0;
      local_48 = (Vector *)dataptr;
      do {
        puVar2 = (local_58->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar9 = uVar12 + 0x40;
          if (local_50 <= uVar12 + 0x40) {
            uVar9 = local_50;
          }
LAB_014d35b7:
          uVar10 = uVar12;
          if (uVar12 < uVar9) {
            uVar8 = uVar12 << 4 | 8;
            do {
              puVar1 = (undefined8 *)((long)ldata + (uVar8 - 8));
              local_68._0_8_ = *puVar1;
              local_68.pointer.ptr = (char *)puVar1[1];
              sVar14 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                                 ((string_t *)&local_68.pointer,(Vector *)dataptr);
              *(long *)((long)result_data + (uVar8 - 8)) = sVar14.value._0_8_;
              *(long *)((long)&result_data->value + uVar8) = sVar14.value._8_8_;
              uVar12 = uVar12 + 1;
              uVar8 = uVar8 + 0x10;
              uVar10 = uVar9;
            } while (uVar9 != uVar12);
          }
        }
        else {
          uVar8 = puVar2[uVar6];
          uVar9 = uVar12 + 0x40;
          if (local_50 <= uVar12 + 0x40) {
            uVar9 = local_50;
          }
          uVar10 = uVar9;
          if (uVar8 != 0) {
            if (uVar8 == 0xffffffffffffffff) goto LAB_014d35b7;
            uVar10 = uVar12;
            dataptr = local_48;
            if (uVar12 < uVar9) {
              uVar13 = uVar12 << 4 | 8;
              uVar11 = 0;
              do {
                if ((uVar8 >> (uVar11 & 0x3f) & 1) != 0) {
                  puVar1 = (undefined8 *)((long)ldata + (uVar13 - 8));
                  local_68._0_8_ = *puVar1;
                  local_68.pointer.ptr = (char *)puVar1[1];
                  sVar14 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                                     ((string_t *)&local_68.pointer,local_48);
                  *(long *)((long)result_data + (uVar13 - 8)) = sVar14.value._0_8_;
                  *(long *)((long)&result_data->value + uVar13) = sVar14.value._8_8_;
                }
                uVar11 = uVar11 + 1;
                uVar13 = uVar13 + 0x10;
                uVar10 = uVar9;
                dataptr = local_48;
              } while (uVar9 - uVar12 != uVar11);
            }
          }
        }
        uVar6 = uVar6 + 1;
        uVar12 = uVar10;
      } while (uVar6 != local_40);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}